

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hadamard.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::Hadamard<std::complex<float>_>::matrix(Hadamard<std::complex<float>_> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 (*pauVar3) [16];
  data_type extraout_RDX;
  SquareMatrix<std::complex<float>_> SVar4;
  
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)0x2;
  pauVar3 = (undefined1 (*) [16])operator_new__(0x20);
  *(undefined8 *)*pauVar3 = 0;
  *(undefined8 *)(*pauVar3 + 8) = 0;
  *(undefined8 *)pauVar3[1] = 0;
  *(undefined8 *)(pauVar3[1] + 8) = 0;
  *(undefined1 (**) [16])&(this->super_QGate1<std::complex<float>_>).qubit_ = pauVar3;
  auVar2._8_4_ = 0x3f3504f3;
  auVar2._0_8_ = 0x3f3504f3;
  auVar2._12_4_ = 0;
  *pauVar3 = auVar2;
  auVar1._8_4_ = 0xbf3504f3;
  auVar1._0_8_ = 0x3f3504f3;
  auVar1._12_4_ = 0;
  pauVar3[1] = auVar1;
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using R = qclab::real_t< T > ;
          const R sqrt2 = R(1) / std::sqrt( R(2) ) ;
          return qclab::dense::SquareMatrix< T >( sqrt2 ,  sqrt2 ,
                                                  sqrt2 , -sqrt2 ) ;
        }